

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20
                   + lVar2);
  plVar1[-0x2d] = 0x98c060;
  plVar1[2] = 0x98c178;
  plVar1[-0x1c] = 0x98c088;
  plVar1[-0x1a] = 0x98c0b0;
  plVar1[-0x13] = 0x98c0d8;
  plVar1[-0xd] = 0x98c100;
  plVar1[-6] = 0x98c128;
  plVar1[-4] = 0x98c150;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__0098c198);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}